

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O2

bool_t xdr_enum(XDR *__xdrs,enum_t *__ep)

{
  uint *puVar1;
  xdr_op xVar2;
  uint uVar3;
  bool_t bVar4;
  undefined8 in_RAX;
  
  xVar2 = __xdrs[2].x_op;
  bVar4 = (bool_t)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (xVar2 != XDR_FREE) {
    if (xVar2 == XDR_DECODE) {
      puVar1 = *(uint **)&__xdrs->x_handy + 1;
      if (__xdrs[1].x_private < puVar1) {
        bVar4 = (*(code *)**(undefined8 **)__xdrs)();
        return bVar4;
      }
      uVar3 = **(uint **)&__xdrs->x_handy;
      *__ep = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      *(uint **)&__xdrs->x_handy = puVar1;
      return (bool_t)CONCAT71((int7)((ulong)puVar1 >> 8),1);
    }
    if (xVar2 == XDR_ENCODE) {
      uVar3 = *__ep;
      puVar1 = *(uint **)&__xdrs->x_handy + 1;
      if (__xdrs[1].x_base < puVar1) {
        bVar4 = (**(code **)(*(long *)__xdrs + 8))();
        return bVar4;
      }
      **(uint **)&__xdrs->x_handy =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      *(uint **)&__xdrs->x_handy = puVar1;
      return bVar4;
    }
    bVar4 = 0;
  }
  return bVar4;
}

Assistant:

static inline bool
xdr_enum(XDR *xdrs, enum_t *ep)
{
	switch (xdrs->x_op) {

	case XDR_ENCODE:
		return (xdr_putenum(xdrs, *ep));

	case XDR_DECODE:
		return (xdr_getenum(xdrs, ep));

	case XDR_FREE:
		return (true);
	}
	/* NOTREACHED */
	return (false);
}